

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spfgmr_serial.c
# Opt level: O2

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,realtype tol,int lr)

{
  int iVar1;
  realtype *flagvalue;
  realtype *flagvalue_00;
  realtype *flagvalue_01;
  long lVar2;
  long lVar3;
  int iVar4;
  
  flagvalue = N_VGetArrayPointer(r_vec);
  iVar1 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar4 = 1;
  if (iVar1 == 0) {
    flagvalue_00 = N_VGetArrayPointer(z_vec);
    iVar1 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar1 == 0) {
      flagvalue_01 = N_VGetArrayPointer(*(N_Vector *)((long)Data + 8));
      iVar1 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar1 == 0) {
        iVar4 = 0;
        lVar2 = *Data;
        if (*Data < 1) {
          lVar2 = 0;
        }
        for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
          flagvalue_00[lVar3] = flagvalue[lVar3] / flagvalue_01[lVar3];
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, realtype tol, int lr)
{
  /* local variables */
  realtype *r, *z, *d;
  sunindextype i;
  UserData *ProbData;
  
  /* access user data structure and vector data */
  ProbData = (UserData *) Data;
  r = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) return 1;
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) return 1;
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) return 1;
  
  /* iterate through domain, performing Jacobi solve */
  for (i=0; i<ProbData->N; i++) 
    z[i] = r[i] / d[i];

  /* return with success */
  return 0;
}